

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall cmCTest::GenerateNotesFile(cmCTest *this,VectorOfStrings *files)

{
  bool bVar1;
  int iVar2;
  cmXMLWriter xml;
  cmGeneratedFileStream ofs;
  long *local_400;
  long local_3f0 [2];
  undefined1 local_3e0 [112];
  ios_base local_370 [264];
  cmGeneratedFileStream local_268;
  
  cmGeneratedFileStream::cmGeneratedFileStream(&local_268);
  local_3e0._0_8_ = local_3e0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"Notes.xml","");
  bVar1 = OpenOutputFile(this,&this->CurrentTag,(string *)local_3e0,&local_268,false);
  if ((undefined1 *)local_3e0._0_8_ != local_3e0 + 0x10) {
    operator_delete((void *)local_3e0._0_8_,local_3e0._16_8_ + 1);
  }
  if (bVar1) {
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_3e0,(ostream *)&local_268,0);
    GenerateCTestNotesOutput(this,(cmXMLWriter *)local_3e0,files);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_3e0);
    iVar2 = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3e0,"Cannot open notes file",0x16);
    std::ios::widen((char)(ostream *)local_3e0 + (char)*(undefined8 *)(local_3e0._0_8_ + -0x18));
    std::ostream::put((char)local_3e0);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x684,(char *)local_400,false);
    if (local_400 != local_3f0) {
      operator_delete(local_400,local_3f0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
    std::ios_base::~ios_base(local_370);
    iVar2 = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_268);
  return iVar2;
}

Assistant:

int cmCTest::GenerateNotesFile(const VectorOfStrings &files)
{
  cmGeneratedFileStream ofs;
  if ( !this->OpenOutputFile(this->CurrentTag, "Notes.xml", ofs) )
    {
    cmCTestLog(this, ERROR_MESSAGE, "Cannot open notes file" << std::endl);
    return 1;
    }
  cmXMLWriter xml(ofs);
  this->GenerateCTestNotesOutput(xml, files);
  return 0;
}